

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_EB_utils.cpp
# Opt level: O1

void amrex::single_level_redistribute
               (MultiFab *div_tmp_in,MultiFab *div_out,int div_comp,int ncomp,Geometry *geom)

{
  MultiFab weights;
  FabFactory<amrex::FArrayBox> local_1e0;
  MFInfo local_1d8;
  FabArray<amrex::FArrayBox> local_1a8;
  
  local_1d8.alloc = true;
  local_1d8._1_7_ = 0;
  local_1d8.arena = (Arena *)0x0;
  local_1d8.tags.
  super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_1d8.tags.
  super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_1d8.tags.
  super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_1e0._vptr_FabFactory = (_func_int **)&PTR__FabFactory_008378d0;
  MultiFab::MultiFab((MultiFab *)&local_1a8,
                     &(div_out->super_FabArray<amrex::FArrayBox>).super_FabArrayBase.boxarray,
                     &(div_out->super_FabArray<amrex::FArrayBox>).super_FabArrayBase.distributionMap
                     ,1,(div_tmp_in->super_FabArray<amrex::FArrayBox>).super_FabArrayBase.n_grow.
                        vect[0],&local_1d8,&local_1e0);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_1d8.tags.
             super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           );
  FabArray<amrex::FArrayBox>::setVal<amrex::FArrayBox,_0>
            (&local_1a8,1.0,0,local_1a8.super_FabArrayBase.n_comp,
             &local_1a8.super_FabArrayBase.n_grow);
  single_level_weighted_redistribute(div_tmp_in,div_out,(MultiFab *)&local_1a8,div_comp,ncomp,geom);
  MultiFab::~MultiFab((MultiFab *)&local_1a8);
  return;
}

Assistant:

void single_level_redistribute (MultiFab& div_tmp_in, MultiFab& div_out,
                                    int div_comp, int ncomp, const Geometry& geom)
    {
        // We create a weighting array to use inside the redistribution array
        MultiFab weights(div_out.boxArray(), div_out.DistributionMap(), 1, div_tmp_in.nGrow());
        weights.setVal(1.0);

        single_level_weighted_redistribute (div_tmp_in, div_out, weights, div_comp, ncomp, geom);
    }